

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_shared_mutex.hpp
# Opt level: O0

bool __thiscall
yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>::
try_lock_for<long,std::ratio<60l,1l>>
          (basic_shared_timed_mutex<yamc::rwlock::TaskFairness> *this,
          duration<long,_std::ratio<60L,_1L>_> *duration)

{
  bool bVar1;
  undefined1 local_38 [8];
  unique_lock<std::mutex> lk;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tp;
  duration<long,_std::ratio<60L,_1L>_> *duration_local;
  basic_shared_mutex<yamc::rwlock::ReaderPrefer> *this_local;
  
  tp.__d.__r = (duration)(duration)duration;
  lk._8_8_ = std::chrono::_V2::steady_clock::now();
  local_20 = std::chrono::operator+
                       ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)&lk._M_owns,(duration<long,_std::ratio<60L,_1L>_> *)tp.__d.__r);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_38,(mutex_type *)(this + 0x60));
  bVar1 = detail::shared_mutex_base<yamc::rwlock::TaskFairness>::
          impl_try_lockwait<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    ((shared_mutex_base<yamc::rwlock::TaskFairness> *)this,
                     (unique_lock<std::mutex> *)local_38,&local_20);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  return bVar1;
}

Assistant:

bool try_lock_for(const std::chrono::duration<Rep, Period>& duration)
  {
    const auto tp = std::chrono::steady_clock::now() + duration;
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    return base::impl_try_lockwait(lk, tp);
  }